

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmListFileBacktrace __thiscall
TargetPropertyEntryString::GetBacktrace(TargetPropertyEntryString *this)

{
  pointer *ppSVar1;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  cmListFileBacktrace cVar3;
  cmListFileBacktrace cVar4;
  
  (in_RDI->field_0).Bottom.State =
       (cmState *)
       (this->Backtrace).TopEntry.
       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar2 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
           (this->Backtrace).TopEntry.
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (in_RDI->field_0).Bottom.Position.Tree = pcVar2;
  if (pcVar2 != (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      ppSVar1 = &(pcVar2->Data).
                 super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *(int *)ppSVar1 = *(int *)ppSVar1 + 1;
      cVar3.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      cVar3.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           in_RDI;
      return (cmListFileBacktrace)
             cVar3.TopEntry.
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    ppSVar1 = &(pcVar2->Data).
               super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *(int *)ppSVar1 = *(int *)ppSVar1 + 1;
    UNLOCK();
  }
  cVar4.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  cVar4.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (cmListFileBacktrace)
         cVar4.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace GetBacktrace() const override { return this->Backtrace; }